

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

void __thiscall Assimp::Ogre::Skeleton::~Skeleton(Skeleton *this)

{
  pointer ppAVar1;
  pointer ppBVar2;
  
  Reset(this);
  ppAVar1 = (this->animations).
            super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppAVar1 != (pointer)0x0) {
    operator_delete(ppAVar1,(long)(this->animations).
                                  super__Vector_base<Assimp::Ogre::Animation_*,_std::allocator<Assimp::Ogre::Animation_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar1
                   );
  }
  ppBVar2 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppBVar2 != (pointer)0x0) {
    operator_delete(ppBVar2,(long)(this->bones).
                                  super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppBVar2
                   );
    return;
  }
  return;
}

Assistant:

Skeleton::~Skeleton()
{
    Reset();
}